

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O0

dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this,size_type pos,
          bool val)

{
  unsigned_long uVar1;
  size_type __n;
  reference pvVar2;
  byte in_DL;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  undefined7 in_stack_ffffffffffffffe8;
  
  if (in_RSI < (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI->m_num_bits)
  {
    if ((in_DL & 1) == 0) {
      reset(in_RSI,CONCAT17(in_DL,in_stack_ffffffffffffffe8) & 0x1ffffffffffffff);
    }
    else {
      uVar1 = bit_mask(0x15e27d);
      __n = block_index((size_type)in_RSI);
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&in_RDI->m_bits,__n);
      *pvVar2 = uVar1 | *pvVar2;
    }
    return in_RDI;
  }
  __assert_fail("pos < m_num_bits",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                ,0x3bb,
                "dynamic_bitset<Block, Allocator> &boost::dynamic_bitset<>::set(size_type, bool) [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
               );
}

Assistant:

dynamic_bitset<Block, Allocator>&
dynamic_bitset<Block, Allocator>::set(size_type pos, bool val)
{
    assert(pos < m_num_bits);

    if (val)
        m_bits[block_index(pos)] |= bit_mask(pos);
    else
        reset(pos);

    return *this;
}